

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZEigenAnalysis.cpp
# Opt level: O1

TPZEigenSolver<std::complex<double>_> * __thiscall
TPZEigenAnalysis::EigenSolver<std::complex<double>>(TPZEigenAnalysis *this)

{
  TPZSolver *pTVar1;
  TPZEigenSolver<std::complex<double>_> *pTVar2;
  
  pTVar1 = (this->super_TPZAnalysis).fSolver;
  if (pTVar1 == (TPZSolver *)0x0) {
    pTVar2 = (TPZEigenSolver<std::complex<double>_> *)0x0;
  }
  else {
    pTVar2 = (TPZEigenSolver<std::complex<double>_> *)
             __dynamic_cast(pTVar1,&TPZSolver::typeinfo,
                            &TPZEigenSolver<std::complex<double>>::typeinfo,0);
  }
  if (pTVar2 == (TPZEigenSolver<std::complex<double>_> *)0x0 && pTVar1 != (TPZSolver *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "TPZEigenSolver<TVar> &TPZEigenAnalysis::EigenSolver() [TVar = std::complex<double>]"
               ,0x53);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," incompatible Solver type! Aborting\n",0x24);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Analysis/TPZEigenAnalysis.cpp"
               ,0x33);
  }
  return pTVar2;
}

Assistant:

TPZEigenSolver<TVar> &TPZEigenAnalysis::EigenSolver()
{
    const auto tmp = dynamic_cast<TPZEigenSolver<TVar>*>(fSolver);
    if(fSolver && !tmp){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" incompatible Solver type! Aborting\n";
        DebugStop();
    }
    return *tmp;
}